

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adjacency_list.hpp
# Opt level: O0

pair<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_bool> *
boost::
add_edge<boost::adjacency_list<boost::vecS,boost::vecS,boost::undirectedS,boost::property<boost::vertex_distance_t,int,boost::no_property>,boost::property<boost::edge_weight_t,double,boost::no_property>,boost::no_property,boost::listS>,boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::undirectedS,boost::property<boost::vertex_distance_t,int,boost::no_property>,boost::property<boost::edge_weight_t,double,boost::no_property>,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::undirectedS,boost::property<boost::vertex_distance_t,int,boost::no_property>,boost::property<boost::edge_weight_t,double,boost::no_property>,boost::no_property,boost::listS>::config,boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::undirectedS,boost::property<boost::vertex_distance_t,int,boost::no_property>,boost::property<boost::edge_weight_t,double,boost::no_property>,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::undirectedS,boost::property<boost::vertex_distance_t,int,boost::no_property>,boost::property<boost::edge_weight_t,double,boost::no_property>,boost::no_property,boost::listS>::config>>
          (vertex_descriptor u,vertex_descriptor v,edge_property_type *p,
          vec_adj_list_impl<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::property<boost::vertex_distance_t,_int,_boost::no_property>,_boost::property<boost::edge_weight_t,_double,_boost::no_property>,_boost::no_property,_boost::listS>,_boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::property<boost::vertex_distance_t,_int,_boost::no_property>,_boost::property<boost::edge_weight_t,_double,_boost::no_property>,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::property<boost::vertex_distance_t,_int,_boost::no_property>,_boost::property<boost::edge_weight_t,_double,_boost::no_property>,_boost::no_property,_boost::listS>::config,_boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::property<boost::vertex_distance_t,_int,_boost::no_property>,_boost::property<boost::edge_weight_t,_double,_boost::no_property>,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::property<boost::vertex_distance_t,_int,_boost::no_property>,_boost::property<boost::edge_weight_t,_double,_boost::no_property>,_boost::no_property,_boost::listS>::config>_>
          *g_)

{
  ulong uVar1;
  unsigned_long *puVar2;
  vertices_size_type vVar3;
  pair<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_bool> *in_RDI;
  vector<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::property<boost::vertex_distance_t,_int,_boost::no_property>,_boost::property<boost::edge_weight_t,_double,_boost::no_property>,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::property<boost::vertex_distance_t,_int,_boost::no_property>,_boost::property<boost::edge_weight_t,_double,_boost::no_property>,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::property<boost::vertex_distance_t,_int,_boost::no_property>,_boost::property<boost::edge_weight_t,_double,_boost::no_property>,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::property<boost::vertex_distance_t,_int,_boost::no_property>,_boost::property<boost::edge_weight_t,_double,_boost::no_property>,_boost::no_property,_boost::listS>::config::stored_vertex>_>
  *in_R8;
  adj_list_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::property<boost::vertex_distance_t,_int,_boost::no_property>,_boost::property<boost::edge_weight_t,_double,_boost::no_property>,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::property<boost::vertex_distance_t,_int,_boost::no_property>,_boost::property<boost::edge_weight_t,_double,_boost::no_property>,_boost::no_property,_boost::listS>::config,_boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::property<boost::vertex_distance_t,_int,_boost::no_property>,_boost::property<boost::edge_weight_t,_double,_boost::no_property>,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::property<boost::vertex_distance_t,_int,_boost::no_property>,_boost::property<boost::edge_weight_t,_double,_boost::no_property>,_boost::no_property,_boost::listS>::config>_>
  *g;
  vertex_descriptor x;
  undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::property<boost::vertex_distance_t,_int,_boost::no_property>,_boost::property<boost::edge_weight_t,_double,_boost::no_property>,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::property<boost::vertex_distance_t,_int,_boost::no_property>,_boost::property<boost::edge_weight_t,_double,_boost::no_property>,_boost::no_property,_boost::listS>::config>
  *in_stack_00000138;
  edge_property_type *in_stack_00000140;
  vertex_descriptor in_stack_00000148;
  vertex_descriptor in_stack_00000150;
  adj_list_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::property<boost::vertex_distance_t,_int,_boost::no_property>,_boost::property<boost::edge_weight_t,_double,_boost::no_property>,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::property<boost::vertex_distance_t,_int,_boost::no_property>,_boost::property<boost::edge_weight_t,_double,_boost::no_property>,_boost::no_property,_boost::listS>::config,_boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::property<boost::vertex_distance_t,_int,_boost::no_property>,_boost::property<boost::edge_weight_t,_double,_boost::no_property>,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::property<boost::vertex_distance_t,_int,_boost::no_property>,_boost::property<boost::edge_weight_t,_double,_boost::no_property>,_boost::no_property,_boost::listS>::config>_>
  *in_stack_ffffffffffffffd0;
  ulong __new_size;
  unsigned_long local_10;
  unsigned_long local_8;
  
  puVar2 = std::max<unsigned_long>(&local_8,&local_10);
  uVar1 = *puVar2;
  __new_size = uVar1;
  vVar3 = num_vertices<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::undirectedS,boost::property<boost::vertex_distance_t,int,boost::no_property>,boost::property<boost::edge_weight_t,double,boost::no_property>,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::undirectedS,boost::property<boost::vertex_distance_t,int,boost::no_property>,boost::property<boost::edge_weight_t,double,boost::no_property>,boost::no_property,boost::listS>::config,boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::undirectedS,boost::property<boost::vertex_distance_t,int,boost::no_property>,boost::property<boost::edge_weight_t,double,boost::no_property>,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::undirectedS,boost::property<boost::vertex_distance_t,int,boost::no_property>,boost::property<boost::edge_weight_t,double,boost::no_property>,boost::no_property,boost::listS>::config>>
                    (in_stack_ffffffffffffffd0);
  if (vVar3 <= uVar1) {
    std::
    vector<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::property<boost::vertex_distance_t,_int,_boost::no_property>,_boost::property<boost::edge_weight_t,_double,_boost::no_property>,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::property<boost::vertex_distance_t,_int,_boost::no_property>,_boost::property<boost::edge_weight_t,_double,_boost::no_property>,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::property<boost::vertex_distance_t,_int,_boost::no_property>,_boost::property<boost::edge_weight_t,_double,_boost::no_property>,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::property<boost::vertex_distance_t,_int,_boost::no_property>,_boost::property<boost::edge_weight_t,_double,_boost::no_property>,_boost::no_property,_boost::listS>::config::stored_vertex>_>
    ::resize(in_R8,__new_size);
  }
  add_edge<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::undirectedS,boost::property<boost::vertex_distance_t,int,boost::no_property>,boost::property<boost::edge_weight_t,double,boost::no_property>,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::undirectedS,boost::property<boost::vertex_distance_t,int,boost::no_property>,boost::property<boost::edge_weight_t,double,boost::no_property>,boost::no_property,boost::listS>::config>
            (in_stack_00000150,in_stack_00000148,in_stack_00000140,in_stack_00000138);
  return in_RDI;
}

Assistant:

inline std::pair<typename Config::edge_descriptor, bool>
    add_edge(typename Config::vertex_descriptor u,
             typename Config::vertex_descriptor v,
             const typename Config::edge_property_type& p,
             vec_adj_list_impl<Graph, Config, Base>& g_)
    {
      BOOST_USING_STD_MAX();
      typename Config::vertex_descriptor x = max BOOST_PREVENT_MACRO_SUBSTITUTION(u, v);
      if (x >= num_vertices(g_))
        g_.m_vertices.resize(x + 1);
      adj_list_helper<Config, Base>& g = g_;
      return add_edge(u, v, p, g);
    }